

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
CETime::TimeDbl2Vect(vector<double,_std::allocator<double>_> *__return_storage_ptr__,double *time)

{
  double dVar1;
  reference pvVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  allocator<double> local_39;
  undefined1 local_38 [16];
  value_type_conflict1 local_28;
  
  local_38._8_8_ = local_38._0_8_;
  local_28 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,4,&local_28,&local_39)
  ;
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  local_38._0_8_ = *time;
  dVar1 = floor((double)local_38._0_8_);
  local_38._0_8_ = (double)local_38._0_8_ - dVar1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,3);
  *pvVar2 = (value_type)local_38._0_8_;
  dVar1 = floor(*time);
  local_38._0_8_ = (undefined8)((int)dVar1 % 100);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  *pvVar2 = (value_type)local_38._0_8_;
  local_38._0_8_ = *time;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  dVar1 = floor((double)local_38._0_8_ - *pvVar2);
  local_38._0_8_ = (undefined8)(((int)dVar1 / 100) % 100);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = (value_type)local_38._0_8_;
  local_38._0_8_ = *time;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  local_38._0_8_ = (double)local_38._0_8_ - *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  dVar1 = floor((double)local_38._0_8_ - *pvVar2);
  local_38._8_4_ = SUB84((double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),0);
  local_38._0_8_ = (double)(int)(dVar1 / 10000.0);
  local_38._12_4_ =
       (int)((ulong)(double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) >> 0x20);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = (value_type)local_38._0_8_;
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CETime::TimeDbl2Vect(const double& time)
{
    // Create a vector to hold the information
    std::vector<double> time_vect(4,0.0) ;
    
    // Get the seconds fraction
    time_vect[3] = time - std::floor(time) ;
    // Get the seconds value
    time_vect[2] = int(std::floor(time)) % 100 ;
    // Get the minutes
    time_vect[1] = int(std::floor(time - time_vect[2]))/100 % 100 ;
    // Get the hours
    time_vect[0] = int(std::floor(time - time_vect[2] - time_vect[1])/10000) ;
    
    return time_vect ;
}